

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placeholder_impl.cpp
# Opt level: O3

Panel __thiscall ui::panel::PlaceHolder(panel *this,string *title)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Panel PVar1;
  undefined1 local_29;
  PlaceHolderImpl *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (PlaceHolderImpl *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ui::PlaceHolderImpl,std::allocator<ui::PlaceHolderImpl>,std::__cxx11::string_const&>
            (a_Stack_20,&local_28,(allocator<ui::PlaceHolderImpl> *)&local_29,title);
  *(PlaceHolderImpl **)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_20[0]._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Panel)PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Panel PlaceHolder(const std::string& title) {
  return Make<PlaceHolderImpl>(title);
}